

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiStorage::SetInt(ImGuiStorage *this,ImGuiID key,int val)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  Pair *__dest;
  ImGuiContext *pIVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  Pair *pPVar10;
  long lVar11;
  
  pIVar4 = GImGui;
  uVar2 = (this->Data).Size;
  lVar7 = (long)(int)uVar2;
  __dest = (this->Data).Data;
  pPVar10 = __dest;
  uVar5 = uVar2;
  if (0 < lVar7) {
    do {
      uVar3 = uVar5 >> 1;
      uVar6 = uVar3;
      if (pPVar10[uVar3].key < key) {
        uVar6 = uVar5 + ~uVar3;
        pPVar10 = pPVar10 + (ulong)uVar3 + 1;
      }
      uVar5 = uVar6;
    } while (0 < (int)uVar6);
  }
  if ((pPVar10 != __dest + lVar7) && (pPVar10->key == key)) {
    (pPVar10->field_1).val_i = val;
    return;
  }
  if ((pPVar10 < __dest) || (__dest + lVar7 < pPVar10)) {
    __assert_fail("it >= Data && it <= Data+Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                  ,0x37b,
                  "iterator ImVector<ImGuiStorage::Pair>::insert(const_iterator, const value_type &) [T = ImGuiStorage::Pair]"
                 );
  }
  lVar11 = (long)pPVar10 - (long)__dest;
  if (uVar2 != (this->Data).Capacity) goto LAB_0011fcc4;
  iVar9 = 4;
  if (uVar2 != 0) {
    iVar9 = uVar2 * 2;
  }
  if (iVar9 <= (int)uVar2) goto LAB_0011fcc4;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (Pair *)(*(pIVar4->IO).MemAllocFn)((long)iVar9 << 4);
  pPVar10 = (this->Data).Data;
  if (pPVar10 == (Pair *)0x0) {
LAB_0011fcac:
    pPVar10 = (Pair *)0x0;
    pIVar4 = GImGui;
  }
  else {
    memcpy(__dest,pPVar10,(long)(this->Data).Size << 4);
    pIVar4 = GImGui;
    pPVar10 = (this->Data).Data;
    if (pPVar10 == (Pair *)0x0) goto LAB_0011fcac;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar4->IO).MemFreeFn)(pPVar10);
  (this->Data).Data = __dest;
  (this->Data).Capacity = iVar9;
  lVar7 = (long)(this->Data).Size;
LAB_0011fcc4:
  lVar8 = lVar7 - (lVar11 >> 4);
  if (lVar8 != 0 && lVar11 >> 4 <= lVar7) {
    memmove((void *)((long)__dest + lVar11 + 0x10),(void *)((long)__dest + lVar11),lVar8 * 0x10);
    __dest = (this->Data).Data;
  }
  *(ImGuiID *)((long)__dest + lVar11) = key;
  *(int *)((long)__dest + lVar11 + 8) = val;
  (this->Data).Size = (this->Data).Size + 1;
  return;
}

Assistant:

void ImGuiStorage::SetInt(ImGuiID key, int val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, Pair(key, val));
        return;
    }
    it->val_i = val;
}